

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_utf_validate(nk_rune *u,int i)

{
  uint in_EAX;
  nk_uint *pnVar1;
  
  if (u != (nk_rune *)0x0) {
    in_EAX = *u;
    if (((in_EAX < nk_utfmin[i]) || ((in_EAX & 0xfffff800) == 0xd800)) || (nk_utfmax[i] < in_EAX)) {
      *u = 0xfffd;
      in_EAX = 0xfffd;
    }
    pnVar1 = nk_utfmax;
    do {
      pnVar1 = pnVar1 + 1;
    } while (*pnVar1 < in_EAX);
  }
  return in_EAX;
}

Assistant:

NK_INTERN int
nk_utf_validate(nk_rune *u, int i)
{
    NK_ASSERT(u);
    if (!u) return 0;
    if (!NK_BETWEEN(*u, nk_utfmin[i], nk_utfmax[i]) ||
         NK_BETWEEN(*u, 0xD800, 0xDFFF))
            *u = NK_UTF_INVALID;
    for (i = 1; *u > nk_utfmax[i]; ++i);
    return i;
}